

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_type *psVar1;
  pointer pcVar2;
  size_type *psVar3;
  double dVar4;
  int iVar5;
  ostream *poVar6;
  string *psVar7;
  long *plVar8;
  long lVar9;
  Company c;
  Boss b;
  Address a;
  Employee e1;
  Address a1;
  Employee e10;
  Employee e9;
  Employee e8;
  Employee e7;
  Employee e6;
  Employee e5;
  Employee e4;
  Employee e3;
  Employee e2;
  Boss local_818;
  undefined1 local_758 [184];
  Employee local_6a0;
  Person local_5e8;
  int local_540;
  int iStack_53c;
  int iStack_538;
  int iStack_534;
  Employee local_530;
  Person local_478;
  int local_3d0;
  int iStack_3cc;
  int iStack_3c8;
  int iStack_3c4;
  Person local_3c0;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  Person local_308;
  int local_260;
  int iStack_25c;
  int iStack_258;
  int iStack_254;
  Person local_250;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  Person local_198;
  int local_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  Employee local_e0;
  
  pcVar2 = local_758 + 0x10;
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"iran","");
  psVar1 = &b.super_Employee.super_Person.name._M_string_length;
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"babol","");
  psVar3 = &e1.super_Person.name._M_string_length;
  e1.super_Person._vptr_Person = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e1,"meraj","");
  Address::Address(&a,(string *)local_758,(string *)&b,(string *)&e1);
  if (e1.super_Person._vptr_Person != (_func_int **)psVar3) {
    operator_delete(e1.super_Person._vptr_Person,e1.super_Person.name._M_string_length + 1);
  }
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"iran","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"tehran","");
  e1.super_Person._vptr_Person = (_func_int **)psVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e1,"valiasr","");
  Address::Address(&a1,(string *)local_758,(string *)&b,(string *)&e1);
  if (e1.super_Person._vptr_Person != (_func_int **)psVar3) {
    operator_delete(e1.super_Person._vptr_Person,e1.super_Person.name._M_string_length + 1);
  }
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"s","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"99*ab11789","");
  Employee::Employee(&e1,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"d","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"87*ab11789","");
  Employee::Employee(&e2,(string *)local_758,(string *)&b,&a1,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"f","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"91*ab11789","");
  Employee::Employee(&e3,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"g","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"97*ab23789","");
  Employee::Employee(&e4,(string *)local_758,(string *)&b,&a,2,10,4,3);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"j","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"91*sd11789","");
  Employee::Employee(&e5,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"r","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"91*a11789","");
  Employee::Employee(&e6,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"k","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"95*we01789","");
  Employee::Employee(&e7,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"a","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"94*ab11989","");
  Employee::Employee(&e8,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"c","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"89*ab11189","");
  Employee::Employee(&e9,(string *)local_758,(string *)&b,&a,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"x","");
  b.super_Employee.super_Person._vptr_Person = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&b,"86*a11789","");
  Employee::Employee(&e10,(string *)local_758,(string *)&b,&a1,2,10,4,2);
  if (b.super_Employee.super_Person._vptr_Person != (_func_int **)psVar1) {
    operator_delete(b.super_Employee.super_Person._vptr_Person,
                    b.super_Employee.super_Person.name._M_string_length + 1);
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  local_758._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"sam","");
  c._vptr_Company = (_func_int **)&c.boss;
  std::__cxx11::string::_M_construct<char_const*>((string *)&c,"89*ab11789","");
  Boss::Boss(&b,(string *)local_758,(string *)&c,&a,2,10,4,2,10);
  if ((Boss **)c._vptr_Company != &c.boss) {
    operator_delete(c._vptr_Company,
                    (ulong)((long)&((c.boss)->super_Employee).super_Person._vptr_Person + 1));
  }
  if ((pointer)local_758._0_8_ != pcVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  Person::Person((Person *)local_758,&e1.super_Person);
  local_758._0_8_ = &PTR_validate_00121d20;
  local_758._168_4_ = e1.hourWork;
  local_758._172_4_ = e1.salaryPerHour;
  local_758._176_4_ = e1.workToDo;
  local_758._180_4_ = e1.workDone;
  Person::Person(&local_6a0.super_Person,&e2.super_Person);
  local_6a0.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_6a0.hourWork = e2.hourWork;
  local_6a0.salaryPerHour = e2.salaryPerHour;
  local_6a0.workToDo = e2.workToDo;
  local_6a0.workDone = e2.workDone;
  Person::Person(&local_5e8,&e3.super_Person);
  local_5e8._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_540 = e3.hourWork;
  iStack_53c = e3.salaryPerHour;
  iStack_538 = e3.workToDo;
  iStack_534 = e3.workDone;
  Person::Person(&local_530.super_Person,&e4.super_Person);
  local_530.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_530.hourWork = e4.hourWork;
  local_530.salaryPerHour = e4.salaryPerHour;
  local_530.workToDo = e4.workToDo;
  local_530.workDone = e4.workDone;
  Person::Person(&local_478,&e5.super_Person);
  local_478._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_3d0 = e5.hourWork;
  iStack_3cc = e5.salaryPerHour;
  iStack_3c8 = e5.workToDo;
  iStack_3c4 = e5.workDone;
  Person::Person(&local_3c0,&e6.super_Person);
  local_3c0._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_318 = e6.hourWork;
  iStack_314 = e6.salaryPerHour;
  iStack_310 = e6.workToDo;
  iStack_30c = e6.workDone;
  Person::Person(&local_308,&e7.super_Person);
  local_308._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_260 = e7.hourWork;
  iStack_25c = e7.salaryPerHour;
  iStack_258 = e7.workToDo;
  iStack_254 = e7.workDone;
  Person::Person(&local_250,&e8.super_Person);
  local_250._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_1a8 = e8.hourWork;
  iStack_1a4 = e8.salaryPerHour;
  iStack_1a0 = e8.workToDo;
  iStack_19c = e8.workDone;
  Person::Person(&local_198,&e9.super_Person);
  local_198._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_f0 = e9.hourWork;
  iStack_ec = e9.salaryPerHour;
  iStack_e8 = e9.workToDo;
  iStack_e4 = e9.workDone;
  Person::Person(&local_e0.super_Person,&e10.super_Person);
  local_e0.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121d20;
  local_e0.hourWork = e10.hourWork;
  local_e0.salaryPerHour = e10.salaryPerHour;
  local_e0.workToDo = e10.workToDo;
  local_e0.workDone = e10.workDone;
  c._vptr_Company = (_func_int **)CONCAT71(c._vptr_Company._1_7_,0x65);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&c,1);
  psVar7 = Person::getId_abi_cxx11_(&e1.super_Person);
  c._vptr_Company = (_func_int **)CONCAT71(c._vptr_Company._1_7_,*(psVar7->_M_dataplus)._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&c,1);
  Person::Person((Person *)&local_818,(Person *)&b);
  local_818.super_Employee.hourWork = b.super_Employee.hourWork;
  local_818.super_Employee.salaryPerHour = b.super_Employee.salaryPerHour;
  local_818.super_Employee.workToDo = b.super_Employee.workToDo;
  local_818.super_Employee.workDone = b.super_Employee.workDone;
  local_818.super_Employee.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a60;
  local_818.numberOfEmployee = b.numberOfEmployee;
  Company::Company(&c,0x315,&local_818,(Employee *)local_758);
  local_818.super_Employee.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.super_Employee.super_Person.address.street._M_dataplus._M_p !=
      &local_818.super_Employee.super_Person.address.street.field_2) {
    operator_delete(local_818.super_Employee.super_Person.address.street._M_dataplus._M_p,
                    local_818.super_Employee.super_Person.address.street.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.super_Employee.super_Person.address.city._M_dataplus._M_p !=
      &local_818.super_Employee.super_Person.address.city.field_2) {
    operator_delete(local_818.super_Employee.super_Person.address.city._M_dataplus._M_p,
                    local_818.super_Employee.super_Person.address.city.field_2._M_allocated_capacity
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.super_Employee.super_Person.address.country._M_dataplus._M_p !=
      &local_818.super_Employee.super_Person.address.country.field_2) {
    operator_delete(local_818.super_Employee.super_Person.address.country._M_dataplus._M_p,
                    local_818.super_Employee.super_Person.address.country.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.super_Employee.super_Person.id._M_dataplus._M_p !=
      &local_818.super_Employee.super_Person.id.field_2) {
    operator_delete(local_818.super_Employee.super_Person.id._M_dataplus._M_p,
                    local_818.super_Employee.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.super_Employee.super_Person.name._M_dataplus._M_p !=
      &local_818.super_Employee.super_Person.name.field_2) {
    operator_delete(local_818.super_Employee.super_Person.name._M_dataplus._M_p,
                    local_818.super_Employee.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  iVar5 = Company::getBudget(&c);
  plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  Company::setBudget(&c,0x381);
  iVar5 = Company::getBudget(&c);
  plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  dVar4 = Company::averageEfficiency(&c);
  poVar6 = std::ostream::_M_insert<double>(dVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  Company::gift(&c);
  iVar5 = Employee::getHourWork(&local_6a0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  iVar5 = Employee::getHourWork(&local_e0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  iVar5 = Employee::getHourWork(&local_530);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  Company::payForService(&c);
  iVar5 = Employee::getHourWork(&local_6a0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  iVar5 = Employee::getHourWork(&local_e0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  iVar5 = Employee::getHourWork(&local_530);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  *(uint *)(strcmp + *(long *)(std::cout + -0x18)) =
       *(uint *)(strcmp + *(long *)(std::cout + -0x18)) | 1;
  Company::isEnoughBudget(&c);
  std::ostream::_M_insert<bool>(true);
  Company::~Company(&c);
  lVar9 = 0x730;
  do {
    *(undefined ***)(local_758 + lVar9 + -0xb8) = &PTR_validate_00121a90;
    if ((long *)(local_758 + lVar9 + -0x20) != *(long **)(local_758 + lVar9 + -0x30)) {
      operator_delete(*(long **)(local_758 + lVar9 + -0x30),*(long *)(local_758 + lVar9 + -0x20) + 1
                     );
    }
    if ((long *)(local_758 + lVar9 + -0x40) != *(long **)(local_758 + lVar9 + -0x50)) {
      operator_delete(*(long **)(local_758 + lVar9 + -0x50),*(long *)(local_758 + lVar9 + -0x40) + 1
                     );
    }
    if ((long *)(local_758 + lVar9 + -0x60) != *(long **)(local_758 + lVar9 + -0x70)) {
      operator_delete(*(long **)(local_758 + lVar9 + -0x70),*(long *)(local_758 + lVar9 + -0x60) + 1
                     );
    }
    if ((long *)(local_758 + lVar9 + -0x80) != *(long **)(local_758 + lVar9 + -0x90)) {
      operator_delete(*(long **)(local_758 + lVar9 + -0x90),*(long *)(local_758 + lVar9 + -0x80) + 1
                     );
    }
    if ((long *)(local_758 + lVar9 + -0xa0) != *(long **)(local_758 + lVar9 + -0xb0)) {
      operator_delete(*(long **)(local_758 + lVar9 + -0xb0),*(long *)(local_758 + lVar9 + -0xa0) + 1
                     );
    }
    lVar9 = lVar9 + -0xb8;
  } while (lVar9 != 0);
  b.super_Employee.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)b.super_Employee.super_Person.address.street._M_dataplus._M_p !=
      &b.super_Employee.super_Person.address.street.field_2) {
    operator_delete(b.super_Employee.super_Person.address.street._M_dataplus._M_p,
                    b.super_Employee.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)b.super_Employee.super_Person.address.city._M_dataplus._M_p !=
      &b.super_Employee.super_Person.address.city.field_2) {
    operator_delete(b.super_Employee.super_Person.address.city._M_dataplus._M_p,
                    b.super_Employee.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)b.super_Employee.super_Person.address.country._M_dataplus._M_p !=
      &b.super_Employee.super_Person.address.country.field_2) {
    operator_delete(b.super_Employee.super_Person.address.country._M_dataplus._M_p,
                    b.super_Employee.super_Person.address.country.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)b.super_Employee.super_Person.id._M_dataplus._M_p !=
      &b.super_Employee.super_Person.id.field_2) {
    operator_delete(b.super_Employee.super_Person.id._M_dataplus._M_p,
                    b.super_Employee.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)b.super_Employee.super_Person.name._M_dataplus._M_p !=
      &b.super_Employee.super_Person.name.field_2) {
    operator_delete(b.super_Employee.super_Person.name._M_dataplus._M_p,
                    b.super_Employee.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e10.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e10.super_Person.address.street._M_dataplus._M_p !=
      &e10.super_Person.address.street.field_2) {
    operator_delete(e10.super_Person.address.street._M_dataplus._M_p,
                    e10.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e10.super_Person.address.city._M_dataplus._M_p != &e10.super_Person.address.city.field_2) {
    operator_delete(e10.super_Person.address.city._M_dataplus._M_p,
                    e10.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e10.super_Person.address.country._M_dataplus._M_p !=
      &e10.super_Person.address.country.field_2) {
    operator_delete(e10.super_Person.address.country._M_dataplus._M_p,
                    e10.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e10.super_Person.id._M_dataplus._M_p != &e10.super_Person.id.field_2) {
    operator_delete(e10.super_Person.id._M_dataplus._M_p,
                    e10.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e10.super_Person.name._M_dataplus._M_p != &e10.super_Person.name.field_2) {
    operator_delete(e10.super_Person.name._M_dataplus._M_p,
                    e10.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e9.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e9.super_Person.address.street._M_dataplus._M_p != &e9.super_Person.address.street.field_2)
  {
    operator_delete(e9.super_Person.address.street._M_dataplus._M_p,
                    e9.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e9.super_Person.address.city._M_dataplus._M_p != &e9.super_Person.address.city.field_2) {
    operator_delete(e9.super_Person.address.city._M_dataplus._M_p,
                    e9.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e9.super_Person.address.country._M_dataplus._M_p !=
      &e9.super_Person.address.country.field_2) {
    operator_delete(e9.super_Person.address.country._M_dataplus._M_p,
                    e9.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e9.super_Person.id._M_dataplus._M_p != &e9.super_Person.id.field_2) {
    operator_delete(e9.super_Person.id._M_dataplus._M_p,
                    e9.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e9.super_Person.name._M_dataplus._M_p != &e9.super_Person.name.field_2) {
    operator_delete(e9.super_Person.name._M_dataplus._M_p,
                    e9.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e8.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e8.super_Person.address.street._M_dataplus._M_p != &e8.super_Person.address.street.field_2)
  {
    operator_delete(e8.super_Person.address.street._M_dataplus._M_p,
                    e8.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e8.super_Person.address.city._M_dataplus._M_p != &e8.super_Person.address.city.field_2) {
    operator_delete(e8.super_Person.address.city._M_dataplus._M_p,
                    e8.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e8.super_Person.address.country._M_dataplus._M_p !=
      &e8.super_Person.address.country.field_2) {
    operator_delete(e8.super_Person.address.country._M_dataplus._M_p,
                    e8.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e8.super_Person.id._M_dataplus._M_p != &e8.super_Person.id.field_2) {
    operator_delete(e8.super_Person.id._M_dataplus._M_p,
                    e8.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e8.super_Person.name._M_dataplus._M_p != &e8.super_Person.name.field_2) {
    operator_delete(e8.super_Person.name._M_dataplus._M_p,
                    e8.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e7.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e7.super_Person.address.street._M_dataplus._M_p != &e7.super_Person.address.street.field_2)
  {
    operator_delete(e7.super_Person.address.street._M_dataplus._M_p,
                    e7.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e7.super_Person.address.city._M_dataplus._M_p != &e7.super_Person.address.city.field_2) {
    operator_delete(e7.super_Person.address.city._M_dataplus._M_p,
                    e7.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e7.super_Person.address.country._M_dataplus._M_p !=
      &e7.super_Person.address.country.field_2) {
    operator_delete(e7.super_Person.address.country._M_dataplus._M_p,
                    e7.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e7.super_Person.id._M_dataplus._M_p != &e7.super_Person.id.field_2) {
    operator_delete(e7.super_Person.id._M_dataplus._M_p,
                    e7.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e7.super_Person.name._M_dataplus._M_p != &e7.super_Person.name.field_2) {
    operator_delete(e7.super_Person.name._M_dataplus._M_p,
                    e7.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e6.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e6.super_Person.address.street._M_dataplus._M_p != &e6.super_Person.address.street.field_2)
  {
    operator_delete(e6.super_Person.address.street._M_dataplus._M_p,
                    e6.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e6.super_Person.address.city._M_dataplus._M_p != &e6.super_Person.address.city.field_2) {
    operator_delete(e6.super_Person.address.city._M_dataplus._M_p,
                    e6.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e6.super_Person.address.country._M_dataplus._M_p !=
      &e6.super_Person.address.country.field_2) {
    operator_delete(e6.super_Person.address.country._M_dataplus._M_p,
                    e6.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e6.super_Person.id._M_dataplus._M_p != &e6.super_Person.id.field_2) {
    operator_delete(e6.super_Person.id._M_dataplus._M_p,
                    e6.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e6.super_Person.name._M_dataplus._M_p != &e6.super_Person.name.field_2) {
    operator_delete(e6.super_Person.name._M_dataplus._M_p,
                    e6.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e5.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e5.super_Person.address.street._M_dataplus._M_p != &e5.super_Person.address.street.field_2)
  {
    operator_delete(e5.super_Person.address.street._M_dataplus._M_p,
                    e5.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e5.super_Person.address.city._M_dataplus._M_p != &e5.super_Person.address.city.field_2) {
    operator_delete(e5.super_Person.address.city._M_dataplus._M_p,
                    e5.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e5.super_Person.address.country._M_dataplus._M_p !=
      &e5.super_Person.address.country.field_2) {
    operator_delete(e5.super_Person.address.country._M_dataplus._M_p,
                    e5.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e5.super_Person.id._M_dataplus._M_p != &e5.super_Person.id.field_2) {
    operator_delete(e5.super_Person.id._M_dataplus._M_p,
                    e5.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e5.super_Person.name._M_dataplus._M_p != &e5.super_Person.name.field_2) {
    operator_delete(e5.super_Person.name._M_dataplus._M_p,
                    e5.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e4.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e4.super_Person.address.street._M_dataplus._M_p != &e4.super_Person.address.street.field_2)
  {
    operator_delete(e4.super_Person.address.street._M_dataplus._M_p,
                    e4.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e4.super_Person.address.city._M_dataplus._M_p != &e4.super_Person.address.city.field_2) {
    operator_delete(e4.super_Person.address.city._M_dataplus._M_p,
                    e4.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e4.super_Person.address.country._M_dataplus._M_p !=
      &e4.super_Person.address.country.field_2) {
    operator_delete(e4.super_Person.address.country._M_dataplus._M_p,
                    e4.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e4.super_Person.id._M_dataplus._M_p != &e4.super_Person.id.field_2) {
    operator_delete(e4.super_Person.id._M_dataplus._M_p,
                    e4.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e4.super_Person.name._M_dataplus._M_p != &e4.super_Person.name.field_2) {
    operator_delete(e4.super_Person.name._M_dataplus._M_p,
                    e4.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e3.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e3.super_Person.address.street._M_dataplus._M_p != &e3.super_Person.address.street.field_2)
  {
    operator_delete(e3.super_Person.address.street._M_dataplus._M_p,
                    e3.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e3.super_Person.address.city._M_dataplus._M_p != &e3.super_Person.address.city.field_2) {
    operator_delete(e3.super_Person.address.city._M_dataplus._M_p,
                    e3.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e3.super_Person.address.country._M_dataplus._M_p !=
      &e3.super_Person.address.country.field_2) {
    operator_delete(e3.super_Person.address.country._M_dataplus._M_p,
                    e3.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e3.super_Person.id._M_dataplus._M_p != &e3.super_Person.id.field_2) {
    operator_delete(e3.super_Person.id._M_dataplus._M_p,
                    e3.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e3.super_Person.name._M_dataplus._M_p != &e3.super_Person.name.field_2) {
    operator_delete(e3.super_Person.name._M_dataplus._M_p,
                    e3.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e2.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e2.super_Person.address.street._M_dataplus._M_p != &e2.super_Person.address.street.field_2)
  {
    operator_delete(e2.super_Person.address.street._M_dataplus._M_p,
                    e2.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e2.super_Person.address.city._M_dataplus._M_p != &e2.super_Person.address.city.field_2) {
    operator_delete(e2.super_Person.address.city._M_dataplus._M_p,
                    e2.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e2.super_Person.address.country._M_dataplus._M_p !=
      &e2.super_Person.address.country.field_2) {
    operator_delete(e2.super_Person.address.country._M_dataplus._M_p,
                    e2.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e2.super_Person.id._M_dataplus._M_p != &e2.super_Person.id.field_2) {
    operator_delete(e2.super_Person.id._M_dataplus._M_p,
                    e2.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e2.super_Person.name._M_dataplus._M_p != &e2.super_Person.name.field_2) {
    operator_delete(e2.super_Person.name._M_dataplus._M_p,
                    e2.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  e1.super_Person._vptr_Person = (_func_int **)&PTR_validate_00121a90;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e1.super_Person.address.street._M_dataplus._M_p != &e1.super_Person.address.street.field_2)
  {
    operator_delete(e1.super_Person.address.street._M_dataplus._M_p,
                    e1.super_Person.address.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e1.super_Person.address.city._M_dataplus._M_p != &e1.super_Person.address.city.field_2) {
    operator_delete(e1.super_Person.address.city._M_dataplus._M_p,
                    e1.super_Person.address.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e1.super_Person.address.country._M_dataplus._M_p !=
      &e1.super_Person.address.country.field_2) {
    operator_delete(e1.super_Person.address.country._M_dataplus._M_p,
                    e1.super_Person.address.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e1.super_Person.id._M_dataplus._M_p != &e1.super_Person.id.field_2) {
    operator_delete(e1.super_Person.id._M_dataplus._M_p,
                    e1.super_Person.id.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e1.super_Person.name._M_dataplus._M_p != &e1.super_Person.name.field_2) {
    operator_delete(e1.super_Person.name._M_dataplus._M_p,
                    e1.super_Person.name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a1.street._M_dataplus._M_p != &a1.street.field_2) {
    operator_delete(a1.street._M_dataplus._M_p,a1.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a1.city._M_dataplus._M_p != &a1.city.field_2) {
    operator_delete(a1.city._M_dataplus._M_p,a1.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a1.country._M_dataplus._M_p != &a1.country.field_2) {
    operator_delete(a1.country._M_dataplus._M_p,a1.country.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.street._M_dataplus._M_p != &a.street.field_2) {
    operator_delete(a.street._M_dataplus._M_p,a.street.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.city._M_dataplus._M_p != &a.city.field_2) {
    operator_delete(a.city._M_dataplus._M_p,a.city.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.country._M_dataplus._M_p != &a.country.field_2) {
    operator_delete(a.country._M_dataplus._M_p,a.country.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {

    /*
    Address a0("", "", "");
    cin >> a0;
    cout << a0 << endl;
    Person p0("e", "91qef12389", a0);
    cin >> p0;
    cout << p0 << endl;
    p0.setName("ali");
    cout << p0.getName() << endl;
    Employee e0("sma", "98*ab11789", a0, 8,30,4,1);
    cout << e0.calculateSalary() << endl;
    cout << e0.efficiency() << endl;
    cout << e0;
     */
    //and ... (other functions & ...)

    //Company build
    Address a("iran", "babol", "meraj");
    Address a1("iran", "tehran", "valiasr");
    Employee e1("s", "99*ab11789", a, 2,10,4,2);
    Employee e2("d", "87*ab11789", a1, 2,10,4,2);
    Employee e3("f", "91*ab11789", a, 2,10,4,2);
    Employee e4("g", "97*ab23789", a, 2,10,4,3);
    Employee e5("j", "91*sd11789", a, 2,10,4,2);
    Employee e6("r", "91*a11789", a, 2,10,4,2);
    Employee e7("k", "95*we01789", a, 2,10,4,2);
    Employee e8("a", "94*ab11989", a, 2,10,4,2);
    Employee e9("c", "89*ab11189", a, 2,10,4,2);
    Employee e10("x", "86*a11789", a1, 2,10,4,2);
    Boss b("sam", "89*ab11789", a, 2,10,4,2,10);
    Employee e[] = {e1, e2, e3, e4, e5, e6, e7, e8, e9, e10};
    cout << 'e' << e1.getId()[0];
    Company c(789,b,e);
    cout << c.getBudget() << endl;
    c.setBudget(897);
    cout << c.getBudget() << endl;
//    cout << c.maxEfficiency() << endl;
    cout << c.averageEfficiency() << endl;
    c.gift();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    c.payForService();
    cout << e[1].getHourWork() << "\t" << e[9].getHourWork() << "\t" << e[3].getHourWork() << "\t" << endl;
    cout << boolalpha << c.isEnoughBudget();



    return 0;
}